

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heritage.cc
# Opt level: O2

void __thiscall Heritage::propagateCopyAway(Heritage *this,PcodeOp *op)

{
  Varnode *pVVar1;
  Varnode *newvn;
  
  pVVar1 = *(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    newvn = pVVar1;
    if ((((newvn->flags & 0x10) == 0) || (newvn->def->opcode->opcode != CPUI_COPY)) ||
       (pVVar1 = *(newvn->def->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                  _M_impl.super__Vector_impl_data._M_start, (pVVar1->loc).base != (newvn->loc).base)
       ) break;
  } while ((pVVar1->loc).offset == (newvn->loc).offset);
  Funcdata::totalReplace(this->fd,op->output,newvn);
  Funcdata::opDestroy(this->fd,op);
  return;
}

Assistant:

void Heritage::propagateCopyAway(PcodeOp *op)

{
  Varnode *inVn = op->getIn(0);
  while(inVn->isWritten()) {		// Follow any COPY chain to earliest input
    PcodeOp *nextOp = inVn->getDef();
    if (nextOp->code() != CPUI_COPY) break;
    Varnode *nextIn = nextOp->getIn(0);
    if (nextIn->getAddr() != inVn->getAddr()) break;
    inVn = nextIn;
  }
  fd->totalReplace(op->getOut(),inVn);
  fd->opDestroy(op);
}